

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O3

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker
          (BacktrackingTokenStream<SGParser::GenericToken> *this,size_t markerIndex)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  
  p_Var2 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= markerIndex) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < markerIndex];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       (*(ulong *)(__position._M_node + 1) <= markerIndex)) {
      p_Var2 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
                          *)&this->Markers,__position);
      if (__position._M_node != p_Var2) {
        return true;
      }
      ReleaseExtraBuffers(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool BacktrackingTokenStream<Token>::ReleaseMarker(size_t markerIndex) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;
    // Remove one marker of this value
    if (iMap == Markers.begin()) {
        Markers.erase(iMap);
        ReleaseExtraBuffers();
    } else
        Markers.erase(iMap);
    return true;
}